

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O1

bool __thiscall DActiveButton::AdvanceFrame(DActiveButton *this)

{
  ushort uVar1;
  int iVar2;
  FSwitchDef *pFVar3;
  uint uVar4;
  FSwitchDef **ppFVar5;
  
  ppFVar5 = &this->m_SwitchDef->PairDef;
  if (this->bReturning == false) {
    ppFVar5 = &this->m_SwitchDef;
  }
  pFVar3 = *ppFVar5;
  iVar2 = this->m_Frame;
  this->m_Frame = iVar2 + 1;
  if (iVar2 == pFVar3->NumFrames - 2) {
    if (this->bFlippable != true) {
      return true;
    }
    this->m_Timer = 0x23;
  }
  else {
    this->m_Timer = (uint)pFVar3[1].frames[(long)iVar2 + -3].TimeMin;
    uVar1 = pFVar3[1].frames[(long)iVar2 + -3].TimeRnd;
    if (uVar1 != 0) {
      uVar4 = FRandom::GenRand32(&pr_switchanim);
      this->m_Timer = this->m_Timer + uVar4 % (uint)uVar1;
      return false;
    }
  }
  return false;
}

Assistant:

bool DActiveButton::AdvanceFrame ()
{
	bool ret = false;
	FSwitchDef *def = bReturning? m_SwitchDef->PairDef : m_SwitchDef;

	if (++m_Frame == def->NumFrames - 1)
	{
		if (bFlippable == true)
		{
			m_Timer = BUTTONTIME;
		}
		else
		{
			ret = true;
		}
	}
	else
	{
		m_Timer = def->frames[m_Frame].TimeMin;
		if (def->frames[m_Frame].TimeRnd != 0)
		{
			m_Timer += pr_switchanim(def->frames[m_Frame].TimeRnd);
		}
	}
	return ret;
}